

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

uchar ** traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                   (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                    *node,uchar **dst,size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this;
  pointer __src;
  pointer ppuVar1;
  bool bVar2;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *node_00
  ;
  size_t __n;
  uint index;
  long lVar3;
  
  for (index = 0;
      (ulong)index <
      (ulong)((long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); index = index + 1) {
    bVar2 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
            ::is_trie(node,index);
    if (bVar2) {
      node_00 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                ::get_node(node,index);
      dst = traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                      (node_00,dst,depth + 2,small_sort);
    }
    else {
      this = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[index];
      if (this != (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        __src = (this->_M_impl).super__Vector_impl_data._M_start;
        ppuVar1 = (this->_M_impl).super__Vector_impl_data._M_finish;
        __n = (long)ppuVar1 - (long)__src;
        if (__n != 0) {
          memmove(dst,__src,__n);
        }
        lVar3 = (long)ppuVar1 - (long)__src >> 3;
        if ((char)index != '\0') {
          mkqsort(dst,(int)lVar3,(int)depth);
        }
        dst = dst + lVar3;
        std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this);
        operator_delete(this);
      }
    }
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)node);
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}